

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

int compareElementRecursive
              (QCborContainerPrivate *c1,Element *e1,QCborContainerPrivate *c2,Element *e2,
              Comparison mode)

{
  Type TVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Type TVar5;
  Type TVar6;
  int iVar7;
  quint64 u;
  char *pcVar8;
  size_t *psVar9;
  QCborContainerPrivate *c2_00;
  size_t sVar10;
  size_t __n;
  QCborContainerPrivate *c1_00;
  ulong uVar11;
  ulong uVar12;
  size_t *psVar13;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QUtf8StringView lhs;
  QUtf8StringView lhs_00;
  QStringView lhs_01;
  
  TVar1 = e1->type;
  TVar6 = TVar1;
  if (0xffff < TVar1) {
    TVar6 = Tag;
  }
  TVar5 = e2->type;
  if (0xffff < e2->type) {
    TVar5 = Tag;
  }
  if (TVar6 - TVar5 != 0) {
    return TVar6 - TVar5;
  }
  uVar2 = (e1->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
          super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
  if (((uVar2 & 1) != 0) ||
     (uVar3 = (e2->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
              super_QFlagsStorage<QtCbor::Element::ValueFlag>.i, (uVar3 & 1) != 0)) {
    c2_00 = (QCborContainerPrivate *)0x0;
    c1_00 = (QCborContainerPrivate *)0x0;
    if ((uVar2 & 1) != 0) {
      c1_00 = (e1->field_0).container;
    }
    if (((e2->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
      c2_00 = (e2->field_0).container;
    }
    iVar7 = compareContainer(c1_00,c2_00,mode);
    return iVar7;
  }
  if (c1 == (QCborContainerPrivate *)0x0) {
    psVar9 = (size_t *)0x0;
  }
  else {
    uVar4._0_4_ = e1->type;
    uVar4._4_4_ = e1->flags;
    pcVar8 = (c1->data).d.ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "";
    }
    psVar9 = (size_t *)(pcVar8 + (e1->field_0).value);
    if ((uVar4 & 0x200000000) == 0) {
      psVar9 = (size_t *)0x0;
    }
  }
  if (c2 == (QCborContainerPrivate *)0x0) {
    psVar13 = (size_t *)0x0;
  }
  else {
    uVar12._0_4_ = e2->type;
    uVar12._4_4_ = e2->flags;
    pcVar8 = (c2->data).d.ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "";
    }
    psVar13 = (size_t *)(pcVar8 + (e2->field_0).value);
    if ((uVar12 & 0x200000000) == 0) {
      psVar13 = (size_t *)0x0;
    }
  }
  if (psVar9 == (size_t *)0x0 && psVar13 == (size_t *)0x0) {
    if (TVar1 == Integer) {
      uVar4 = (e1->field_0).value;
      uVar12 = 0x7fffffffffffffff - uVar4;
      if (-1 < (long)uVar4) {
        uVar12 = uVar4;
      }
      uVar4 = (e2->field_0).value;
      uVar11 = 0x7fffffffffffffff - uVar4;
      if (-1 < (long)uVar4) {
        uVar11 = uVar4;
      }
      if (uVar12 != uVar11) {
        return -(uint)(uVar12 < uVar11) | 1;
      }
    }
    if (((TVar1 == Double) || (TVar1 == Tag)) &&
       ((e1->field_0).container != (e2->field_0).container)) {
      return -(uint)((e1->field_0).container < (e2->field_0).container) | 1;
    }
    return 0;
  }
  if (psVar9 == (size_t *)0x0) {
    __n = 0;
  }
  else {
    __n = *psVar9;
  }
  if (psVar13 == (size_t *)0x0) {
    sVar10 = 0;
  }
  else {
    sVar10 = *psVar13;
  }
  if ((__n == 0) || (sVar10 == 0)) {
    if ((long)__n < (long)sVar10) {
      return -1;
    }
    return (uint)(__n != sVar10);
  }
  if ((uVar2 & 4) != 0) {
    if ((uVar3 & 4) != 0) {
      lhs_01.m_size = (long)*psVar9 / 2;
      rhs_01.m_size = (long)*psVar13 / 2;
      rhs_01.m_data = (storage_type_conflict *)(psVar13 + 1);
      lhs_01.m_data = (storage_type_conflict *)(psVar9 + 1);
      iVar7 = compareStringsInUtf8(lhs_01,rhs_01,mode);
      return iVar7;
    }
    if ((uVar2 & 4) != 0) goto LAB_002e5a61;
  }
  if ((uVar3 & 4) == 0) {
    if (__n != sVar10) {
      return (uint)((long)sVar10 <= (long)__n) * 2 + -1;
    }
    if (mode == ForEquality) {
      iVar7 = bcmp(psVar9 + 1,psVar13 + 1,__n);
      return (uint)(iVar7 != 0);
    }
    iVar7 = memcmp(psVar9 + 1,psVar13 + 1,__n);
    return iVar7;
  }
  if ((uVar2 & 4) == 0) {
    rhs.m_size = (long)*psVar13 / 2;
    rhs.m_data = (storage_type_conflict *)(psVar13 + 1);
    lhs.m_size = *psVar9;
    lhs.m_data = (storage_type *)(psVar9 + 1);
    iVar7 = compareStringsInUtf8(lhs,rhs,mode);
    return iVar7;
  }
LAB_002e5a61:
  rhs_00.m_size = (long)*psVar9 / 2;
  rhs_00.m_data = (storage_type_conflict *)(psVar9 + 1);
  lhs_00.m_size = *psVar13;
  lhs_00.m_data = (storage_type *)(psVar13 + 1);
  iVar7 = compareStringsInUtf8(lhs_00,rhs_00,mode);
  return -iVar7;
}

Assistant:

static int compareElementRecursive(const QCborContainerPrivate *c1, const Element &e1,
                                   const QCborContainerPrivate *c2, const Element &e2,
                                   Comparison mode) noexcept
{
    int cmp = typeOrder(e1.type, e2.type);
    if (cmp != 0)
        return cmp;

    if ((e1.flags & Element::IsContainer) || (e2.flags & Element::IsContainer))
        return compareContainer(e1.flags & Element::IsContainer ? e1.container : nullptr,
                                e2.flags & Element::IsContainer ? e2.container : nullptr, mode);

    // string data?
    const ByteData *b1 = c1 ? c1->byteData(e1) : nullptr;
    const ByteData *b2 = c2 ? c2->byteData(e2) : nullptr;
    if (b1 || b2) {
        auto len1 = b1 ? b1->len : 0;
        auto len2 = b2 ? b2->len : 0;
        if (len1 == 0 || len2 == 0)
            return len1 < len2 ? -1 : len1 == len2 ? 0 : 1;

        // we definitely have data from this point forward
        Q_ASSERT(b1);
        Q_ASSERT(b2);

        // Officially with CBOR, we sort first the string with the shortest
        // UTF-8 length. Since US-ASCII is just a subset of UTF-8, its length
        // is the UTF-8 length. But the UTF-16 length may not be directly
        // comparable.
        if ((e1.flags & Element::StringIsUtf16) && (e2.flags & Element::StringIsUtf16))
            return compareStringsInUtf8(b1->asStringView(), b2->asStringView(), mode);

        if (!(e1.flags & Element::StringIsUtf16) && !(e2.flags & Element::StringIsUtf16)) {
            // Neither is UTF-16, so lengths are comparable too
            // (this case includes byte arrays too)
            if (len1 == len2) {
                if (mode == Comparison::ForEquality) {
                    // GCC optimizes this to __memcmpeq(); Clang to bcmp()
                    return memcmp(b1->byte(), b2->byte(), size_t(len1)) == 0 ? 0 : 1;
                }
                return memcmp(b1->byte(), b2->byte(), size_t(len1));
            }
            return len1 < len2 ? -1 : 1;
        }

        // Only one is UTF-16
        if (e1.flags & Element::StringIsUtf16)
            return compareStringsInUtf8(b1->asStringView(), b2->asUtf8StringView(), mode);
        else
            return compareStringsInUtf8(b1->asUtf8StringView(), b2->asStringView(), mode);
    }

    return compareElementNoData(e1, e2);
}